

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader.cpp
# Opt level: O2

bool __thiscall Loader::checkIDCODE(Loader *this)

{
  bool bVar1;
  allocator local_6b;
  allocator local_6a;
  allocator local_69;
  string local_68;
  string local_48;
  string local_28;
  
  bVar1 = setIR(this,IDCODE);
  if (bVar1) {
    std::__cxx11::string::string((string *)&local_28,"00000000",&local_69);
    std::__cxx11::string::string((string *)&local_48,"0362D093",&local_6a);
    std::__cxx11::string::string((string *)&local_68,"0FFFFFFF",&local_6b);
    bVar1 = shiftDR(this,0x20,&local_28,&local_48,&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)&local_28);
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool Loader::checkIDCODE() {
	if (!setIR(IDCODE))
		return false;

	if (!shiftDR(32, "00000000", "0362D093", "0FFFFFFF")) // FPGA IDCODE
		return false;

	return true;
}